

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudManager * Cloud_Init(int nVars,int nBits)

{
  CloudManager *dd_00;
  CloudNode *pCVar1;
  CloudNode **ppCVar2;
  abctime clk2;
  abctime clk1;
  int i;
  CloudManager *dd;
  int nBits_local;
  int nVars_local;
  
  if (100000 < nVars) {
    __assert_fail("nVars <= 100000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x4c,"CloudManager *Cloud_Init(int, int)");
  }
  if (nBits < 0x20) {
    dd._0_4_ = nBits;
    if (nBits == 0) {
      dd._0_4_ = 0x17;
    }
    dd_00 = (CloudManager *)calloc(1,0x130);
    dd_00->nMemUsed = dd_00->nMemUsed + 0x130;
    dd_00->nVars = nVars;
    dd_00->bitsNode = (int)dd;
    for (clk1._4_4_ = 0; (int)clk1._4_4_ < CacheOperNum; clk1._4_4_ = clk1._4_4_ + 1) {
      dd_00->bitsCache[(int)clk1._4_4_] = (int)dd - CacheLogRatioDefault[(int)clk1._4_4_];
    }
    dd_00->shiftUnique = 0x20 - ((int)dd + 1);
    for (clk1._4_4_ = 0; (int)clk1._4_4_ < CacheOperNum; clk1._4_4_ = clk1._4_4_ + 1) {
      dd_00->shiftCache[(int)clk1._4_4_] = 0x20 - dd_00->bitsCache[(int)clk1._4_4_];
    }
    dd_00->nNodesAlloc = 1 << ((byte)(int)dd + 1 & 0x1f);
    dd_00->nNodesLimit = 1 << ((byte)(int)dd & 0x1f);
    Abc_Clock();
    pCVar1 = (CloudNode *)calloc((long)dd_00->nNodesAlloc,0x18);
    dd_00->tUnique = pCVar1;
    dd_00->nMemUsed = dd_00->nMemUsed + dd_00->nNodesAlloc * 0x18;
    Abc_Clock();
    dd_00->nSignCur = 1;
    dd_00->tUnique->s = dd_00->nSignCur;
    dd_00->tUnique->v = 0xfffffff;
    dd_00->tUnique->e = (CloudNode *)0x0;
    dd_00->tUnique->t = (CloudNode *)0x0;
    dd_00->one = dd_00->tUnique;
    dd_00->zero = (CloudNode *)((ulong)dd_00->one ^ 1);
    dd_00->nNodesCur = 1;
    dd_00->pNodeStart = dd_00->tUnique + 1;
    dd_00->pNodeEnd = dd_00->tUnique + dd_00->nNodesAlloc;
    ppCVar2 = (CloudNode **)malloc((long)dd_00->nVars << 3);
    dd_00->vars = ppCVar2;
    dd_00->nMemUsed = dd_00->nMemUsed + dd_00->nVars * 8;
    for (clk1._4_4_ = 0; (int)clk1._4_4_ < dd_00->nVars; clk1._4_4_ = clk1._4_4_ + 1) {
      pCVar1 = cloudMakeNode(dd_00,clk1._4_4_,dd_00->one,dd_00->zero);
      dd_00->vars[(int)clk1._4_4_] = pCVar1;
    }
    return dd_00;
  }
  __assert_fail("nBits < 32",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x4d,"CloudManager *Cloud_Init(int, int)");
}

Assistant:

CloudManager * Cloud_Init( int nVars, int nBits )
{
	CloudManager * dd;
	int i;
	abctime clk1, clk2;

	assert( nVars <= 100000 );
	assert( nBits < 32 );

	// assign the defaults
	if ( nBits == 0 )
		nBits = CLOUD_NODE_BITS;

	// start the manager
	dd = ABC_CALLOC( CloudManager, 1 );
	dd->nMemUsed          += sizeof(CloudManager);

	// variables
	dd->nVars             = nVars;              // the number of variables allocated
	// bits
	dd->bitsNode          = nBits;              // the number of bits used for the node
	for ( i = 0; i < CacheOperNum; i++ )
		dd->bitsCache[i]  = nBits - CacheLogRatioDefault[i];
	// shifts
	dd->shiftUnique       = 8*sizeof(unsigned) - (nBits + 1); // gets node index in the hash table
	for ( i = 0; i < CacheOperNum; i++ )
		dd->shiftCache[i] = 8*sizeof(unsigned) - dd->bitsCache[i];
	// nodes
	dd->nNodesAlloc       = (1 << (nBits + 1)); // 2 ^ (nBits + 1)
	dd->nNodesLimit       = (1 << nBits);       // 2 ^  nBits

	// unique table
clk1 = Abc_Clock();
	dd->tUnique           = ABC_CALLOC( CloudNode, dd->nNodesAlloc );
	dd->nMemUsed         += sizeof(CloudNode) * dd->nNodesAlloc;
clk2 = Abc_Clock();
//ABC_PRT( "calloc() time", clk2 - clk1 ); 

	// set up the constant node (the only node that is not in the hash table)
	dd->nSignCur          = 1;
	dd->tUnique[0].s      = dd->nSignCur;
	dd->tUnique[0].v      = CLOUD_CONST_INDEX;
	dd->tUnique[0].e      = NULL;
	dd->tUnique[0].t      = NULL;
	dd->one               = dd->tUnique;
	dd->zero              = Cloud_Not(dd->one);
	dd->nNodesCur         = 1;

	// special nodes
	dd->pNodeStart        = dd->tUnique + 1;
	dd->pNodeEnd          = dd->tUnique + dd->nNodesAlloc;

	// set up the elementary variables
	dd->vars              = ABC_ALLOC( CloudNode *, dd->nVars );
	dd->nMemUsed         += sizeof(CloudNode *) * dd->nVars;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]   = cloudMakeNode( dd, i, dd->one, dd->zero );

	return dd;
}